

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbwindow.cpp
# Opt level: O2

void __thiscall QXcbWindow::hide(QXcbWindow *this)

{
  QPlatformWindow *pQVar1;
  xcb_connection_t *pxVar2;
  qreal factor;
  char cVar3;
  long lVar4;
  QPlatformWindow *pQVar5;
  long *plVar6;
  QPoint *pQVar7;
  QScreen *pQVar8;
  QPoint QVar9;
  QPoint *pQVar10;
  long lVar11;
  QXcbConnection *this_00;
  long lVar12;
  long in_FS_OFFSET;
  QPointF QVar13;
  QPointF local_e0;
  QPoint local_c8;
  QPointF local_c0;
  QArrayDataPointer<QPlatformScreen_*> local_b0;
  QPoint local_90;
  QPoint local_88;
  undefined8 local_80;
  uint5 uStack_78;
  undefined3 uStack_73;
  undefined4 local_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  long local_60;
  
  local_60 = *(long *)(in_FS_OFFSET + 0x28);
  xcb_unmap_window((((this->super_QXcbObject).m_connection)->super_QXcbBasicConnection).
                   m_xcbConnection);
  _uStack_78 = 0;
  local_70 = 0xaaaaaaaa;
  uStack_6c = 0xaaaaaaaa;
  uStack_68 = 0xaaaaaaaa;
  uStack_64 = 0xaaaaaaaa;
  local_80 = 0x12;
  pQVar1 = &this->super_QPlatformWindow;
  lVar4 = (**(code **)(*(long *)&this->super_QPlatformWindow + 0x18))(pQVar1);
  local_80 = CONCAT44(**(undefined4 **)(*(long *)(lVar4 + 0x20) + 8),(undefined4)local_80);
  uStack_78 = (uint5)this->m_window;
  pxVar2 = (((this->super_QXcbObject).m_connection)->super_QXcbBasicConnection).m_xcbConnection;
  lVar4 = (**(code **)(*(long *)&this->super_QPlatformWindow + 0x18))(pQVar1);
  xcb_send_event(pxVar2,0,**(undefined4 **)(*(long *)(lVar4 + 0x20) + 8),0x180000,&local_80);
  xcb_flush((((this->super_QXcbObject).m_connection)->super_QXcbBasicConnection).m_xcbConnection);
  this_00 = (this->super_QXcbObject).m_connection;
  if (this_00->m_mouseGrabber == this) {
    QXcbConnection::setMouseGrabber((QXcbConnection *)this_00,(QXcbWindow *)0x0);
    this_00 = (this->super_QXcbObject).m_connection;
  }
  if (this_00->m_mousePressWindow != (QXcbWindow *)0x0) {
    pQVar5 = &this_00->m_mousePressWindow->super_QPlatformWindow;
    do {
      if (pQVar5 == pQVar1) {
        QXcbConnection::setMousePressWindow
                  ((QXcbConnection *)(this->super_QXcbObject).m_connection,(QXcbWindow *)0x0);
        break;
      }
      pQVar5 = (QPlatformWindow *)QPlatformWindow::parent();
    } while (pQVar5 != (QPlatformWindow *)0x0);
  }
  this->m_mapped = false;
  QPlatformWindow::window();
  cVar3 = QWindow::isModal();
  if (cVar3 != '\0') {
    plVar6 = (long *)(**(code **)(*(long *)pQVar1 + 0x18))(pQVar1);
    plVar6 = (long *)(**(code **)(*plVar6 + 0xb0))(plVar6);
    local_88 = (QPoint)(**(code **)(*plVar6 + 0x80))(plVar6);
    pQVar7 = (QPoint *)(**(code **)(*(long *)pQVar1 + 0x18))(pQVar1);
    QPlatformScreen::screenForPosition(pQVar7);
    pQVar8 = (QScreen *)QPlatformScreen::screen();
    local_90 = QHighDpi::fromNativePixels<QPoint,QScreen>(&local_88,pQVar8);
    local_b0.size = -0x5555555555555556;
    local_b0.d._0_4_ = 0xaaaaaaaa;
    local_b0.d._4_4_ = 0xaaaaaaaa;
    local_b0.ptr._0_4_ = 0xaaaaaaaa;
    local_b0.ptr._4_4_ = 0xaaaaaaaa;
    plVar6 = (long *)(**(code **)(*(long *)pQVar1 + 0x18))(pQVar1);
    (**(code **)(*plVar6 + 0x88))(&local_b0,plVar6);
    lVar4 = CONCAT44(local_b0.ptr._4_4_,local_b0.ptr._0_4_);
    lVar12 = local_b0.size << 3;
    lVar11 = 0;
    do {
      if (lVar12 == lVar11) goto LAB_0016b7e4;
      plVar6 = *(long **)(lVar4 + lVar11);
      QVar13 = (QPointF)(**(code **)(*plVar6 + 0x20))(plVar6);
      local_c0 = QVar13;
      cVar3 = QRect::contains((QPoint *)&local_c0,SUB81(&local_90,0));
      lVar11 = lVar11 + 8;
    } while (cVar3 == '\0');
    pQVar8 = (QScreen *)QPlatformScreen::screen();
    QVar9 = QHighDpi::toNativePixels<QPoint,QScreen>(&local_90,pQVar8);
    local_c0.xp = (qreal)QVar9;
    pQVar7 = (QPoint *)(**(code **)(*plVar6 + 0x80))(plVar6);
    if (pQVar7 != (QPoint *)0x0) {
      pQVar10 = (QPoint *)QPlatformWindow::window();
      if (pQVar7 != pQVar10) {
        pQVar10 = (QPoint *)childWindowAt((QWindow *)pQVar7,&local_90);
        if (pQVar10 != (QPoint *)0x0) {
          pQVar7 = pQVar10;
        }
        local_c8 = (QPoint)QWindow::mapFromGlobal(pQVar7);
        factor = QHighDpiScaling::factor<QWindow>((QWindow *)pQVar7);
        QVar9 = operator*(&local_c8,factor);
        local_c0.xp = (qreal)QVar9.xp.m_i.m_i;
        local_c0.yp = (qreal)QVar9.yp.m_i.m_i;
        local_e0.xp = (qreal)local_88.xp.m_i.m_i;
        local_e0.yp = (qreal)local_88.yp.m_i.m_i;
        QWindowSystemInterface::handleEnterEvent<QWindowSystemInterface::DefaultDelivery>
                  ((QWindow *)pQVar7,&local_c0,&local_e0);
      }
    }
LAB_0016b7e4:
    QArrayDataPointer<QPlatformScreen_*>::~QArrayDataPointer(&local_b0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_60) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QXcbWindow::hide()
{
    xcb_unmap_window(xcb_connection(), m_window);

    // send synthetic UnmapNotify event according to icccm 4.1.4
    q_padded_xcb_event<xcb_unmap_notify_event_t> event = {};
    event.response_type = XCB_UNMAP_NOTIFY;
    event.event = xcbScreen()->root();
    event.window = m_window;
    event.from_configure = false;
    xcb_send_event(xcb_connection(), false, xcbScreen()->root(),
                   XCB_EVENT_MASK_SUBSTRUCTURE_NOTIFY | XCB_EVENT_MASK_SUBSTRUCTURE_REDIRECT, (const char *)&event);

    xcb_flush(xcb_connection());

    if (connection()->mouseGrabber() == this)
        connection()->setMouseGrabber(nullptr);
    if (QPlatformWindow *w = connection()->mousePressWindow()) {
        // Unset mousePressWindow when it (or one of its parents) is unmapped
        while (w) {
            if (w == this) {
                connection()->setMousePressWindow(nullptr);
                break;
            }
            w = w->parent();
        }
    }

    m_mapped = false;

    // Hiding a modal window doesn't send an enter event to its transient parent when the
    // mouse is already over the parent window, so the enter event must be emulated.
    if (window()->isModal()) {
        // Get the cursor position at modal window screen
        const QPoint nativePos = xcbScreen()->cursor()->pos();
        const QPoint cursorPos = QHighDpi::fromNativePixels(nativePos, xcbScreen()->screenForPosition(nativePos)->screen());

        // Find the top level window at cursor position.
        // Don't use QGuiApplication::topLevelAt(): search only the virtual siblings of this window's screen
        QWindow *enterWindow = nullptr;
        const auto screens = xcbScreen()->virtualSiblings();
        for (QPlatformScreen *screen : screens) {
            if (screen->geometry().contains(cursorPos)) {
                const QPoint devicePosition = QHighDpi::toNativePixels(cursorPos, screen->screen());
                enterWindow = screen->topLevelAt(devicePosition);
                break;
            }
        }

        if (enterWindow && enterWindow != window()) {
            // Find the child window at cursor position, otherwise use the top level window
            if (QWindow *childWindow = childWindowAt(enterWindow, cursorPos))
                enterWindow = childWindow;
            const QPoint localPos = enterWindow->mapFromGlobal(cursorPos);
            QWindowSystemInterface::handleEnterEvent(enterWindow,
                                                     localPos * QHighDpiScaling::factor(enterWindow),
                                                     nativePos);
        }
    }
}